

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  int iVar1;
  DataKey DVar2;
  DataKey *pDVar3;
  long lVar4;
  uint *puVar5;
  uint *puVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  uint *puVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  byte bVar10;
  SPxId enterId;
  SPxId enterIdCo;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_228;
  DataKey local_220;
  cpp_dec_float<200U,_int,_void> local_218;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  cpp_dec_float<200U,_int,_void> local_118;
  cpp_dec_float<200U,_int,_void> local_98;
  
  bVar10 = 0;
  local_228.info = 0;
  local_228.idx = -1;
  local_220.info = 0;
  local_220.idx = -1;
  local_218.data._M_elems[0] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[0];
  puVar6 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 1;
  puVar8 = local_218.data._M_elems;
  puVar5 = puVar6;
  for (lVar4 = 0x1b; puVar8 = puVar8 + 1, lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = *puVar5;
    puVar5 = puVar5 + 1;
  }
  local_218.exp =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  local_218.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_218.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  local_218.neg =
       (bool)((local_218.data._M_elems[0] != 0 || local_218.fpclass != cpp_dec_float_finite) ^
             (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg);
  puVar8 = local_198.m_backend.data._M_elems;
  for (lVar4 = 0x1b; puVar8 = (uint *)((long)puVar8 + 4), lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = *puVar6;
    puVar6 = puVar6 + 1;
  }
  local_198.m_backend.data._M_elems[0] = local_218.data._M_elems[0];
  local_198.m_backend.exp = local_218.exp;
  local_198.m_backend.neg = local_218.neg;
  local_198.m_backend.fpclass = local_218.fpclass;
  local_198.m_backend.prec_elem = local_218.prec_elem;
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnter == true) {
    local_228 = (DataKey)selectEnterSparseDim
                                   (this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_218,(SPxId *)&local_228);
  }
  else {
    local_228 = (DataKey)selectEnterDenseDim(this,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&local_218,(SPxId *)&local_228);
  }
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnterCo == true) {
    DVar2 = (DataKey)selectEnterSparseCoDim(this,&local_198,(SPxId *)&local_228);
  }
  else {
    DVar2 = (DataKey)selectEnterDenseCoDim(this,&local_198,(SPxId *)&local_228);
  }
  local_220 = DVar2;
  if (local_228.info != 0) {
    local_98.fpclass = cpp_dec_float_finite;
    local_98.prec_elem = 0x1c;
    local_98.data._M_elems[0] = 0;
    local_98.data._M_elems[1] = 0;
    local_98.data._M_elems[2] = 0;
    local_98.data._M_elems[3] = 0;
    local_98.data._M_elems[4] = 0;
    local_98.data._M_elems[5] = 0;
    local_98.data._M_elems[6] = 0;
    local_98.data._M_elems[7] = 0;
    local_98.data._M_elems[8] = 0;
    local_98.data._M_elems[9] = 0;
    local_98.data._M_elems[10] = 0;
    local_98.data._M_elems[0xb] = 0;
    local_98.data._M_elems[0xc] = 0;
    local_98.data._M_elems[0xd] = 0;
    local_98.data._M_elems[0xe] = 0;
    local_98.data._M_elems[0xf] = 0;
    local_98.data._M_elems[0x10] = 0;
    local_98.data._M_elems[0x11] = 0;
    local_98.data._M_elems[0x12] = 0;
    local_98.data._M_elems[0x13] = 0;
    local_98.data._M_elems[0x14] = 0;
    local_98.data._M_elems[0x15] = 0;
    local_98.data._M_elems[0x16] = 0;
    local_98.data._M_elems[0x17] = 0;
    local_98.data._M_elems[0x18] = 0;
    local_98.data._M_elems[0x19] = 0;
    local_98.data._M_elems._104_5_ = 0;
    local_98.data._M_elems[0x1b]._1_3_ = 0;
    local_98.exp = 0;
    local_98.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_98,0.8);
    pnVar7 = &local_198;
    pcVar9 = &local_118;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pcVar9->data)._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
      pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar7 + ((ulong)bVar10 * -2 + 1) * 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar10 * -8 + 4);
    }
    local_118.exp = local_198.m_backend.exp;
    local_118.neg = local_198.m_backend.neg;
    local_118.prec_elem = local_198.m_backend.prec_elem;
    local_118.fpclass = local_198.m_backend.fpclass;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&local_118,&local_98);
    if ((((local_218.fpclass != cpp_dec_float_NaN) && (local_118.fpclass != cpp_dec_float_NaN)) &&
        (iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_218,&local_118), pDVar3 = &local_228, 0 < iVar1)) ||
       (pDVar3 = &local_228, DVar2.info == 0)) goto LAB_005aa10b;
  }
  pDVar3 = &local_220;
LAB_005aa10b:
  return (SPxId)*pDVar3;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}